

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * __thiscall tcu::Format::Enum<int,_1UL>::toStream(Enum<int,_1UL> *this,ostream *stream)

{
  char *pcVar1;
  ostream *poVar2;
  
  pcVar1 = (*this->m_getName)(this->m_value);
  if (pcVar1 != (char *)0x0) {
    poVar2 = std::operator<<(stream,pcVar1);
    return poVar2;
  }
  poVar2 = Format::operator<<(stream,(Hex<2UL>)(long)this->m_value);
  return poVar2;
}

Assistant:

std::ostream& toStream (std::ostream& stream) const
	{
		const char* name = m_getName(m_value);
		if (name)
			return stream << name;
		else
			return stream << Hex<NumBytes*2>((deUint64)m_value);
	}